

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS viscosity_law(REF_DBL t,REF_DBL reference_temp_k,REF_DBL *mu)

{
  double dVar1;
  
  *mu = 1.0;
  if (0.0 < reference_temp_k) {
    if (t < 0.0) {
      dVar1 = sqrt(t);
    }
    else {
      dVar1 = SQRT(t);
    }
    *mu = ((110.56 / reference_temp_k + 1.0) / (110.56 / reference_temp_k + t)) * t * dVar1;
  }
  return 0;
}

Assistant:

REF_STATUS viscosity_law(REF_DBL t, REF_DBL reference_temp_k, REF_DBL *mu) {
  REF_DBL sutherland_constant_k = 110.56;
  REF_DBL sutherland_temp;
  *mu = 1.0;
  if (reference_temp_k > 0.0) {
    sutherland_temp = sutherland_constant_k / reference_temp_k;
    *mu = (1.0 + sutherland_temp) / (t + sutherland_temp) * t * sqrt(t);
  }
  return REF_SUCCESS;
}